

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::scan
               (Reducer *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  StringNew *pSVar5;
  ContBind *pCVar6;
  Drop *pDVar7;
  TableGet *pTVar8;
  CallRef *pCVar9;
  Unary *pUVar10;
  Call *pCVar11;
  ArrayInitData *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Switch *pSVar16;
  ArrayNew *pAVar17;
  Return *pRVar18;
  StructNew *pSVar19;
  BrOn *pBVar20;
  Suspend *pSVar21;
  Store *pSVar22;
  Throw *pTVar23;
  StringWTF16Get *pSVar24;
  ResumeThrow *pRVar25;
  TupleMake *pTVar26;
  ArrayNewFixed *pAVar27;
  StringEq *currp_00;
  PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_> *pPVar28;
  ulong uVar29;
  Break *pBVar30;
  StringConcat *currp_01;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar29 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case IfId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitIf,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::If>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)((If *)pSVar24 + 0x20));
    goto LAB_00126c60;
  case LoopId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitLoop,currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::Loop>(this);
    goto LAB_001267e1;
  case BreakId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitBreak,currp);
    pBVar30 = Expression::cast<wasm::Break>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pBVar30 + 0x28));
    pBVar30 = pBVar30 + 0x20;
    goto LAB_001266bf;
  case SwitchId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSwitch,currp)
    ;
    pSVar16 = Expression::cast<wasm::Switch>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pSVar16 + 0x48));
    pBVar30 = (Break *)(pSVar16 + 0x40);
    goto LAB_001266bf;
  case CallId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar29 = (ulong)*(uint *)(pCVar11 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar11 + 0x10),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case CallIndirectId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitCallIndirect,
               currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pCVar13 + 0x38));
    uVar29 = (ulong)*(uint *)(pCVar13 + 0x20);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar13 + 0x18),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitLocalGet,
               currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitLocalSet,
               currp);
    pUVar10 = (Unary *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00126a75;
  case GlobalGetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitGlobalGet,
               currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitGlobalSet,
               currp);
    pTVar8 = (TableGet *)Expression::cast<wasm::GlobalSet>(this);
    goto LAB_001267e1;
  case LoadId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    currp_01 = (StringConcat *)(pLVar14 + 0x30);
    goto LAB_00126c78;
  case StoreId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStore,currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_00126a38;
  case ConstId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitUnary,currp);
    pUVar10 = Expression::cast<wasm::Unary>(this);
    goto LAB_00126a75;
  case BinaryId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitBinary,currp)
    ;
    pSVar5 = (StringNew *)Expression::cast<wasm::Binary>(this);
    goto LAB_001269d2;
  case SelectId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSelect,currp)
    ;
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::Select>(this);
    goto LAB_00126c51;
  case DropId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitDrop,currp);
    pDVar7 = Expression::cast<wasm::Drop>(this);
    goto LAB_00126882;
  case ReturnId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitReturn,currp)
    ;
    pRVar18 = Expression::cast<wasm::Return>(this);
    pBVar30 = (Break *)(pRVar18 + 0x10);
    goto LAB_001266bf;
  case MemorySizeId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitMemoryGrow,
               currp);
    pDVar7 = (Drop *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00126882;
  case NopId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitAtomicRMW,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00126ac0;
  case AtomicCmpxchgId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitAtomicCmpxchg
               ,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00126ab1;
  case AtomicWaitId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitAtomicWait,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00126805;
  case AtomicNotifyId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitAtomicNotify,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_001269d2;
  case AtomicFenceId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSIMDExtract,
               currp);
    pUVar10 = (Unary *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00126a75;
  case SIMDReplaceId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSIMDReplace,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::SIMDReplace>(this);
    currp_00 = (StringEq *)((SIMDReplace *)pSVar5 + 0x28);
    goto LAB_001269e0;
  case SIMDShuffleId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSIMDShuffle,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00126c60;
  case SIMDTernaryId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSIMDTernary,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00126805;
  case SIMDShiftId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSIMDShift,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_001269d2;
  case SIMDLoadId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSIMDLoad,
               currp);
    pBVar20 = (BrOn *)Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00126960;
  case SIMDLoadStoreLaneId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00126a38:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pSVar22 + 0x38));
    currp_01 = (StringConcat *)(pSVar22 + 0x30);
    goto LAB_00126c78;
  case MemoryInitId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitMemoryInit,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00126ab1;
  case DataDropId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitDataDrop,
               currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitMemoryCopy,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00126c51;
  case MemoryFillId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitMemoryFill,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00126c51;
  case PopId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRefNull,currp
              );
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRefIsNull,
               currp);
    pDVar7 = (Drop *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00126882;
  case RefFuncId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRefFunc,currp
              );
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRefEq,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00126c60;
  case TableGetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTableGet,
               currp);
    pTVar8 = Expression::cast<wasm::TableGet>(this);
LAB_001267e1:
    currp_01 = (StringConcat *)(pTVar8 + 0x20);
    goto LAB_00126c78;
  case TableSetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTableSet,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00126ac0;
  case TableSizeId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTableSize,
               currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTableGrow,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00126ac0;
  case TableFillId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTableFill,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00126ab1;
  case TableCopyId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTableCopy,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_00126c51;
  case TableInitId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTableInit,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00126ab1;
  case TryId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar29 = (ulong)*(uint *)(pTVar15 + 0x50);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar15 + 0x48),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    currp_01 = (StringConcat *)(pTVar15 + 0x20);
    goto LAB_00126c78;
  case TryTableId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTryTable,
               currp);
    pDVar7 = (Drop *)Expression::cast<wasm::TryTable>(this);
    goto LAB_00126882;
  case ThrowId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitThrow,currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar29 = (ulong)*(uint *)(pTVar23 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar23 + 0x20),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRethrow,currp
              );
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitThrowRef,
               currp);
    pDVar7 = (Drop *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00126882;
  case TupleMakeId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTupleMake,
               currp);
    pTVar26 = Expression::cast<wasm::TupleMake>(this);
    uVar29 = (ulong)(uint)(pTVar26->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar26->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitTupleExtract,
               currp);
    pDVar7 = (Drop *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00126882;
  case RefI31Id:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRefI31,currp)
    ;
    pDVar7 = (Drop *)Expression::cast<wasm::RefI31>(this);
    goto LAB_00126882;
  case I31GetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitI31Get,currp)
    ;
    pDVar7 = (Drop *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00126882;
  case CallRefId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitCallRef,currp
              );
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pCVar9 + 0x30));
    uVar29 = (ulong)*(uint *)(pCVar9 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar9 + 0x10),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRefTest,currp
              );
    pDVar7 = (Drop *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00126882;
  case RefCastId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRefCast,currp
              );
    pDVar7 = (Drop *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00126882;
  case BrOnId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitBrOn,currp);
    pBVar20 = Expression::cast<wasm::BrOn>(this);
LAB_00126960:
    currp_01 = (StringConcat *)(pBVar20 + 0x28);
    goto LAB_00126c78;
  case StructNewId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStructNew,
               currp);
    pSVar19 = Expression::cast<wasm::StructNew>(this);
    uVar29 = (ulong)*(uint *)(pSVar19 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar19 + 0x10),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStructGet,
               currp);
    pUVar10 = (Unary *)Expression::cast<wasm::StructGet>(this);
    goto LAB_00126a75;
  case StructSetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStructSet,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StructSet>(this);
    goto LAB_001269d2;
  case StructRMWId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStructRMW,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_001269d2;
  case StructCmpxchgId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStructCmpxchg
               ,currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_00126805:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)((StringEq *)pSVar5 + 0x28));
LAB_0012681e:
    currp_00 = (StringEq *)pSVar5 + 0x20;
    goto LAB_001269e0;
  case ArrayNewId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayNew,
               currp);
    pAVar17 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pAVar17 + 0x18));
    pBVar30 = (Break *)(pAVar17 + 0x10);
LAB_001266bf:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::maybePushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)pBVar30);
    return;
  case ArrayNewDataId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayNewData,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00126ac0;
  case ArrayNewElemId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayNewElem,
               currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00126ac0;
  case ArrayNewFixedId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayNewFixed
               ,currp);
    pAVar27 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar29 = (ulong)*(uint *)(pAVar27 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pAVar27 + 0x10),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayGet,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00126c60;
  case ArraySetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArraySet,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00126c51;
  case ArrayLenId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayLen,
               currp);
    pDVar7 = (Drop *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00126882;
  case ArrayCopyId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayCopy,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)((ArrayCopy *)pSVar24 + 0x30));
    goto LAB_00126c42;
  case ArrayFillId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayFill,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::ArrayFill>(this);
LAB_00126c42:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)((StringConcat *)pSVar24 + 0x28));
    goto LAB_00126c51;
  case ArrayInitDataId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayInitData
               ,currp);
    pAVar12 = Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_001262d7;
  case ArrayInitElemId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitArrayInitElem
               ,currp);
    pAVar12 = (ArrayInitData *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_001262d7:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pAVar12 + 0x38));
LAB_00126ab1:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pAVar12 + 0x30));
LAB_00126ac0:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pAVar12 + 0x28));
    currp_01 = (StringConcat *)(pAVar12 + 0x20);
    goto LAB_00126c78;
  case RefAsId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitRefAs,currp);
    pUVar10 = (Unary *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00126a75;
  case StringNewId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStringNew,
               currp);
    pSVar5 = Expression::cast<wasm::StringNew>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pSVar5 + 0x28));
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pSVar5 + 0x20));
    goto LAB_001269eb;
  case StringConstId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStringMeasure
               ,currp);
    pUVar10 = (Unary *)Expression::cast<wasm::StringMeasure>(this);
LAB_00126a75:
    currp_01 = (StringConcat *)&pUVar10->value;
    goto LAB_00126c78;
  case StringEncodeId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStringEncode,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StringEncode>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::maybePushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)((StringEncode *)pSVar5 + 0x28));
    goto LAB_0012681e;
  case StringConcatId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStringConcat,
               currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00126c60;
  case StringEqId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStringEq,
               currp);
    pSVar5 = (StringNew *)Expression::cast<wasm::StringEq>(this);
LAB_001269d2:
    currp_00 = (StringEq *)pSVar5 + 0x20;
LAB_001269e0:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)currp_00);
LAB_001269eb:
    currp_01 = (StringConcat *)((StringEq *)pSVar5 + 0x18);
    goto LAB_00126c78;
  case StringWTF16GetId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::
               doVisitStringWTF16Get,currp);
    pSVar24 = Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00126c60;
  case StringSliceWTFId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::
               doVisitStringSliceWTF,currp);
    pSVar24 = (StringWTF16Get *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00126c51:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)((StringConcat *)pSVar24 + 0x20));
LAB_00126c60:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)((StringConcat *)pSVar24 + 0x18));
    currp_01 = (StringConcat *)pSVar24 + 0x10;
    goto LAB_00126c78;
  case ContNewId:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitContNew,currp
              );
    pDVar7 = (Drop *)Expression::cast<wasm::ContNew>(this);
LAB_00126882:
    currp_01 = (StringConcat *)&pDVar7->value;
LAB_00126c78:
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)currp_01);
    return;
  case ContBindId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitContBind,
               currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pCVar6 + 0x30));
    uVar29 = (ulong)*(uint *)(pCVar6 + 0x18);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar6 + 0x10),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case SuspendId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitSuspend,currp
              );
    pSVar21 = Expression::cast<wasm::Suspend>(this);
    uVar29 = (ulong)*(uint *)(pSVar21 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar21 + 0x20),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case ResumeId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitResume,currp)
    ;
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pRVar2 + 0x70));
    uVar29 = (ulong)*(uint *)(pRVar2 + 0x58);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar2 + 0x50),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case ResumeThrowId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitResumeThrow,
               currp);
    pRVar25 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pRVar25 + 0x80));
    uVar29 = (ulong)*(uint *)(pRVar25 + 0x68);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar25 + 0x60),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
    break;
  case StackSwitchId:
    pPVar28 = &(self->
               super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
               ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>;
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
               Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::doVisitStackSwitch,
               currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
              (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,scan,
               (Expression **)(pSVar3 + 0x40));
    uVar29 = (ulong)*(uint *)(pSVar3 + 0x28);
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar3 + 0x20),uVar29);
      Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::pushTask
                (&pPVar28->super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,
                 scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }